

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int find_param(VARR_token_t *params,char *name)

{
  char cVar1;
  token_t *pptVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  FILE *__stream;
  undefined8 in_RCX;
  size_t sVar9;
  char *str;
  VARR_char *pVVar10;
  char *pcVar11;
  c2m_ctx_t c2m_ctx;
  char *__filename;
  size_t sVar12;
  
  iVar4 = (int)in_RCX;
  if (params != (VARR_token_t *)0x0) {
    sVar9 = params->els_num;
    pcVar11 = "__VA_ARGS__";
    c2m_ctx = (c2m_ctx_t)name;
    iVar3 = strcmp(name,"__VA_ARGS__");
    iVar4 = (int)CONCAT71((int7)((ulong)in_RCX >> 8),sVar9 != 0 && iVar3 == 0);
    if (sVar9 != 0 && iVar3 == 0) {
      if (params->varr == (token_t *)0x0) goto LAB_00193fd3;
      if (*(short *)params->varr[sVar9 - 1] == 0x10f) {
        sVar12 = (size_t)((int)sVar9 - 1);
        goto LAB_00193fba;
      }
LAB_00193f8c:
      pptVar2 = params->varr;
      if (pptVar2 == (token_t *)0x0) goto LAB_00193fce;
      sVar12 = 0;
      do {
        iVar4 = strcmp(pptVar2[sVar12]->repr,name);
        if (iVar4 == 0) goto LAB_00193fba;
        sVar12 = sVar12 + 1;
      } while (sVar9 != sVar12);
    }
    else if (sVar9 != 0) goto LAB_00193f8c;
    sVar12 = 0xffffffff;
LAB_00193fba:
    return (int)sVar12;
  }
  find_param_cold_3();
  pcVar11 = name;
  c2m_ctx = (c2m_ctx_t)params;
LAB_00193fce:
  find_param_cold_1();
LAB_00193fd3:
  find_param_cold_2();
  pVVar10 = c2m_ctx->temp_string;
  if ((pVVar10 == (VARR_char *)0x0) || (pcVar8 = pVVar10->varr, pcVar8 == (char *)0x0)) {
LAB_0019419d:
    get_full_name_cold_4();
  }
  else {
    pVVar10->els_num = 0;
    if (*pcVar11 == '\0') {
      if ((str == (char *)0x0) || (pcVar11 = str, *str == '\0')) {
        __assert_fail("name != NULL && name[0] != \'\\0\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x97c,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)"
                     );
      }
      goto LAB_00194186;
    }
    if (iVar4 == 0) {
      __filename = pcVar11;
      pcVar6 = strrchr(pcVar11,0x2f);
      if (pcVar6 == (char *)0x0) {
        add_to_temp_string(c2m_ctx,".");
LAB_001940a5:
        add_to_temp_string(c2m_ctx,"/");
      }
      else {
        if (pcVar6 < pcVar11) {
          uVar7 = 1;
          sVar9 = 0;
        }
        else {
          do {
            pVVar10 = c2m_ctx->temp_string;
            pcVar8 = pVVar10->varr;
            if (pcVar8 == (char *)0x0) {
              get_full_name_cold_2();
              goto LAB_0019419d;
            }
            sVar9 = pVVar10->els_num;
            cVar1 = *pcVar11;
            uVar7 = sVar9 + 1;
            if (pVVar10->size < uVar7) {
              sVar5 = (uVar7 >> 1) + uVar7;
              __filename = pcVar8;
              pcVar8 = (char *)realloc(pcVar8,sVar5);
              pVVar10->varr = pcVar8;
              pVVar10->size = sVar5;
              sVar9 = pVVar10->els_num;
              uVar7 = sVar9 + 1;
            }
            pcVar11 = pcVar11 + 1;
            pVVar10->els_num = uVar7;
            pcVar8[sVar9] = cVar1;
          } while (pcVar11 <= pcVar6);
          pVVar10 = c2m_ctx->temp_string;
          pcVar8 = pVVar10->varr;
          if (pcVar8 == (char *)0x0) {
            get_full_name_cold_1();
            __stream = fopen(__filename,"r");
            if (__stream != (FILE *)0x0) {
              fclose(__stream);
            }
            return (uint)(__stream != (FILE *)0x0);
          }
          sVar9 = pVVar10->els_num;
          uVar7 = sVar9 + 1;
        }
        if (pVVar10->size < uVar7) {
          sVar5 = (uVar7 >> 1) + uVar7;
          pcVar8 = (char *)realloc(pcVar8,sVar5);
          pVVar10->varr = pcVar8;
          pVVar10->size = sVar5;
          sVar9 = pVVar10->els_num;
          uVar7 = sVar9 + 1;
        }
        pVVar10->els_num = uVar7;
        pcVar8[sVar9] = '\0';
      }
    }
    else {
      sVar5 = strlen(pcVar11);
      if (sVar5 == 0) goto LAB_001941a7;
      add_to_temp_string(c2m_ctx,pcVar11);
      if (pcVar11[sVar5 - 1] != '/') goto LAB_001940a5;
    }
    add_to_temp_string(c2m_ctx,str);
    if (c2m_ctx->temp_string != (VARR_char *)0x0) {
      pcVar11 = c2m_ctx->temp_string->varr;
LAB_00194186:
      return (int)pcVar11;
    }
  }
  get_full_name_cold_3();
LAB_001941a7:
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x984,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)");
}

Assistant:

static int find_param (VARR (token_t) * params, const char *name) {
  size_t len = VARR_LENGTH (token_t, params);
  token_t param;

  if (strcmp (name, varg) == 0 && len != 0 && VARR_LAST (token_t, params)->code == T_DOTS)
    return (int) len - 1;
  for (size_t i = 0; i < len; i++) {
    param = VARR_GET (token_t, params, i);
    if (strcmp (param->repr, name) == 0) return (int) i;
  }
  return -1;
}